

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformAccessLogger::assign1i
          (UniformAccessLogger *this,string *name,int x)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_1a0;
  int local_20;
  int local_1c;
  int loc;
  int x_local;
  string *name_local;
  UniformAccessLogger *this_local;
  
  local_1c = x;
  _loc = name;
  name_local = (string *)this;
  local_20 = getLocation(this,name);
  tcu::TestLog::operator<<(&local_1a0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [25])"// Assigning to uniform ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,_loc);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a0a8b4);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1c);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  (*this->m_gl->uniform1i)(local_20,local_1c);
  return;
}

Assistant:

void UniformAccessLogger::assign1i (const string& name, int x)
{
	const int loc = getLocation(name);
	m_log << TestLog::Message << "// Assigning to uniform " << name << ": " << x << TestLog::EndMessage;
	m_gl.uniform1i(loc, x);
}